

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

_Bool ecs_query_next(ecs_iter_t *it)

{
  int iVar1;
  int iVar2;
  ecs_query_t *query_00;
  ecs_table_t *table_00;
  ecs_vector_t *bitset_columns_00;
  ecs_vector_t *sparse_columns_00;
  int iVar3;
  void *pvVar4;
  ecs_data_t *peVar5;
  ecs_matched_table_t *local_a8;
  _Bool local_99;
  ecs_entity_t *entity_buffer;
  int ret;
  ecs_vector_t *sparse_columns;
  ecs_vector_t *bitset_columns;
  ecs_data_t *data;
  ecs_table_t *table;
  ecs_matched_table_t *table_data;
  int i;
  int32_t prev_count;
  int32_t table_count;
  ecs_page_cursor_t cur;
  ecs_matched_table_t *tables;
  ecs_table_slice_t *slice;
  ecs_query_t *query;
  ecs_world_t *world;
  ecs_page_iter_t *piter;
  ecs_query_iter_t *iter;
  ecs_iter_t *it_local;
  
  iter = (ecs_query_iter_t *)it;
  _ecs_assert(it != (ecs_iter_t *)0x0,2,(char *)0x0,"it != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0xae8);
  if (iter == (ecs_query_iter_t *)0x0) {
    __assert_fail("it != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xae8,"_Bool ecs_query_next(ecs_iter_t *)");
  }
  world = (ecs_world_t *)&iter[4].bitset_first;
  query = *(ecs_query_t **)&iter->page_iter;
  query_00 = *(ecs_query_t **)&iter[1].index;
  piter = (ecs_page_iter_t *)world;
  ecs_get_stage((ecs_world_t **)&query);
  pvVar4 = _ecs_vector_first(query_00->table_slices,0x10,0x10);
  cur = (ecs_page_cursor_t)_ecs_vector_first(query_00->tables,0x50,0x10);
  local_99 = true;
  if (pvVar4 != (void *)0x0) {
    local_99 = query_00->compare != (ecs_compare_action_t)0x0;
  }
  _ecs_assert(local_99,0xc,(char *)0x0,"!slice || query->compare",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0xaf4);
  if ((pvVar4 != (void *)0x0) && (query_00->compare == (ecs_compare_action_t)0x0)) {
    __assert_fail("!slice || query->compare",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xaf4,"_Bool ecs_query_next(ecs_iter_t *)");
  }
  iVar1 = iter[1].sparse_first;
  iVar2 = iter[4].page_iter.offset;
  table_data._4_4_ = piter[1].offset;
  do {
    if (iVar1 <= table_data._4_4_) {
      return false;
    }
    if (pvVar4 == (void *)0x0) {
      local_a8 = (ecs_matched_table_t *)((long)cur + (long)table_data._4_4_ * 0x50);
    }
    else {
      local_a8 = *(ecs_matched_table_t **)((long)pvVar4 + (long)table_data._4_4_ * 0x10);
    }
    table_00 = (local_a8->iter_data).table;
    piter[1].offset = table_data._4_4_ + 1;
    if (table_00 == (ecs_table_t *)0x0) goto LAB_00125ef1;
    bitset_columns_00 = local_a8->bitset_columns;
    sparse_columns_00 = local_a8->sparse_columns;
    peVar5 = ecs_table_get_data(table_00);
    _ecs_assert(peVar5 != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xb06);
    if (peVar5 == (ecs_data_t *)0x0) {
      __assert_fail("data != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0xb06,"_Bool ecs_query_next(ecs_iter_t *)");
    }
    *(ecs_column_t **)&iter[2].page_iter.remaining = peVar5->columns;
    if (pvVar4 == (void *)0x0) {
      prev_count = 0;
      table_count = ecs_table_count(table_00);
    }
    else {
      prev_count = *(int32_t *)((long)pvVar4 + (long)table_data._4_4_ * 0x10 + 8);
      table_count = *(int32_t *)((long)pvVar4 + (long)table_data._4_4_ * 0x10 + 0xc);
    }
    if (table_count != 0) {
      if (bitset_columns_00 != (ecs_vector_t *)0x0) {
        iVar3 = bitset_column_next(table_00,bitset_columns_00,(ecs_query_iter_t *)piter,
                                   (ecs_page_cursor_t *)&prev_count);
        if (iVar3 == -1) goto LAB_00125f37;
        piter[1].offset = table_data._4_4_;
      }
      if (sparse_columns_00 != (ecs_vector_t *)0x0) {
        iVar3 = sparse_column_next(table_00,local_a8,sparse_columns_00,(ecs_query_iter_t *)piter,
                                   (ecs_page_cursor_t *)&prev_count);
        if (iVar3 == -1) goto LAB_00125f37;
        piter[1].offset = table_data._4_4_;
      }
      iVar3 = ecs_page_iter_next((ecs_page_iter_t *)world,(ecs_page_cursor_t *)&prev_count);
      if (iVar3 < 0) {
        return false;
      }
      if (iVar3 < 1) {
        pvVar4 = _ecs_vector_first(peVar5->entities,8,0x10);
        *(void **)&iter[2].sparse_smallest = (void *)((long)pvVar4 + (long)prev_count * 8);
        iter[3].sparse_first = prev_count;
        iter[3].bitset_first = table_count;
        iter[4].page_iter.offset = table_count;
LAB_00125ef1:
        *(ecs_matched_table_t **)&iter[1].page_iter.limit = local_a8;
        iter[3].sparse_smallest = iVar2 + iter[3].sparse_smallest;
        if (((query_00->flags & 0x400) != 0) && (table_00 != (ecs_table_t *)0x0)) {
          mark_columns_dirty(query_00,local_a8);
        }
        return true;
      }
    }
LAB_00125f37:
    table_data._4_4_ = table_data._4_4_ + 1;
  } while( true );
}

Assistant:

bool ecs_query_next(
    ecs_iter_t *it)
{
    ecs_assert(it != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_query_iter_t *iter = &it->iter.query;
    ecs_page_iter_t *piter = &iter->page_iter;
    ecs_world_t *world = it->world;
    ecs_query_t *query = it->query;

    ecs_get_stage(&world);
    ecs_table_slice_t *slice = ecs_vector_first(
        query->table_slices, ecs_table_slice_t);
    ecs_matched_table_t *tables = ecs_vector_first(
        query->tables, ecs_matched_table_t);

    ecs_assert(!slice || query->compare, ECS_INTERNAL_ERROR, NULL);
    
    ecs_page_cursor_t cur;
    int32_t table_count = it->table_count;
    int32_t prev_count = it->total_count;

    int i;
    for (i = iter->index; i < table_count; i ++) {
        ecs_matched_table_t *table_data = slice ? slice[i].table : &tables[i];
        ecs_table_t *table = table_data->iter_data.table;
        ecs_data_t *data = NULL;

        iter->index = i + 1;
        
        if (table) {
            ecs_vector_t *bitset_columns = table_data->bitset_columns;
            ecs_vector_t *sparse_columns = table_data->sparse_columns;
            data = ecs_table_get_data(table);
            ecs_assert(data != NULL, ECS_INTERNAL_ERROR, NULL);
            it->table_columns = data->columns;
            
            if (slice) {
                cur.first = slice[i].start_row;
                cur.count = slice[i].count;                
            } else {
                cur.first = 0;
                cur.count = ecs_table_count(table);
            }

            if (cur.count) {
                if (bitset_columns) {
            
                    if (bitset_column_next(table, bitset_columns, iter, 
                        &cur) == -1) 
                    {
                        /* No more enabled components for table */
                        continue; 
                    } else {
                        iter->index = i;
                    }
                }

                if (sparse_columns) {
                    if (sparse_column_next(table, table_data,
                        sparse_columns, iter, &cur) == -1)
                    {
                        /* No more elements in sparse column */
                        continue;    
                    } else {
                        iter->index = i;
                    }
                }

                int ret = ecs_page_iter_next(piter, &cur);
                if (ret < 0) {
                    return false;
                } else if (ret > 0) {
                    continue;
                }
            } else {
                continue;
            }

            ecs_entity_t *entity_buffer = ecs_vector_first(
                data->entities, ecs_entity_t); 
            it->entities = &entity_buffer[cur.first];
            it->offset = cur.first;
            it->count = cur.count;
            it->total_count = cur.count;
        }

        it->table = &table_data->iter_data;
        it->frame_offset += prev_count;

        if (query->flags & EcsQueryHasOutColumns) {
            if (table) {
                mark_columns_dirty(query, table_data);
            }
        }

        return true;
    }

    return false;
}